

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedCollator::getRules
          (RuleBasedCollator *this,UColRuleOption delta,UnicodeString *buffer)

{
  ushort uVar1;
  short sVar2;
  CollationTailoring *pCVar3;
  ushort uVar4;
  UnicodeString *this_00;
  int32_t srcLength;
  
  if (delta != UCOL_TAILORING_ONLY) {
    uVar1 = (buffer->fUnion).fStackFields.fLengthAndFlags;
    uVar4 = 2;
    if ((uVar1 & 1) == 0) {
      uVar4 = uVar1 & 0x1e;
    }
    (buffer->fUnion).fStackFields.fLengthAndFlags = uVar4;
    CollationLoader::appendRootRules(buffer);
    pCVar3 = this->tailoring;
    sVar2 = (pCVar3->rules).fUnion.fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      srcLength = (pCVar3->rules).fUnion.fFields.fLength;
    }
    else {
      srcLength = (int)sVar2 >> 5;
    }
    this_00 = UnicodeString::doAppend(buffer,&pCVar3->rules,0,srcLength);
    UnicodeString::getTerminatedBuffer(this_00);
    return;
  }
  UnicodeString::operator=(buffer,&this->tailoring->rules);
  return;
}

Assistant:

void
RuleBasedCollator::getRules(UColRuleOption delta, UnicodeString &buffer) const {
    if(delta == UCOL_TAILORING_ONLY) {
        buffer = tailoring->rules;
        return;
    }
    // UCOL_FULL_RULES
    buffer.remove();
    CollationLoader::appendRootRules(buffer);
    buffer.append(tailoring->rules).getTerminatedBuffer();
}